

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delete_event.cpp
# Opt level: O0

ssize_t __thiscall
cppurses::Delete_event::send(Delete_event *this,int __fd,void *__buf,size_t __n,int __flags)

{
  Widget *pWVar1;
  bool bVar2;
  int iVar3;
  undefined7 extraout_var;
  ulong uVar4;
  pointer pWVar5;
  reference ppWVar6;
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  Widget *w;
  iterator __end1;
  iterator __begin1;
  vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_> *__range1;
  bool result;
  Delete_event *this_local;
  
  pWVar1 = (this->super_Event).receiver_;
  iVar3 = (*pWVar1->_vptr_Widget[0x14])(pWVar1,CONCAT44(in_register_00000034,__fd));
  bVar2 = std::operator==(&this->removed_,(nullptr_t)0x0);
  if (bVar2) {
    uVar4 = CONCAT71(extraout_var,(char)iVar3) & 0xffffffffffffff01;
    this_local._7_1_ = (undefined1)uVar4;
  }
  else {
    pWVar5 = std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>::operator->
                       (&this->removed_);
    Children_data::get_descendants
              ((vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_> *)&__begin1,
               &pWVar5->children);
    __end1 = std::vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>::begin
                       ((vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_> *)&__begin1
                       );
    w = (Widget *)
        std::vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>::end
                  ((vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_> *)&__begin1);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<cppurses::Widget_**,_std::vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>_>
                                  *)&w);
      if (!bVar2) break;
      ppWVar6 = __gnu_cxx::
                __normal_iterator<cppurses::Widget_**,_std::vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>_>
                ::operator*(&__end1);
      (*(*ppWVar6)->_vptr_Widget[0x14])();
      __gnu_cxx::
      __normal_iterator<cppurses::Widget_**,_std::vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>_>
      ::operator++(&__end1);
    }
    std::vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>::~vector
              ((vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_> *)&__begin1);
    std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>::reset
              (&this->removed_,(pointer)0x0);
    uVar4 = CONCAT71((int7)((ulong)extraout_RAX >> 8),(char)iVar3) & 0xffffffffffffff01;
    this_local._7_1_ = (undefined1)uVar4;
  }
  return CONCAT71((int7)(uVar4 >> 8),this_local._7_1_);
}

Assistant:

bool Delete_event::send() const {
    const auto result = receiver_.delete_event();
    if (removed_ == nullptr) {
        return result;
    }
    for (Widget* w : removed_->children.get_descendants()) {
        w->delete_event();
    }
    removed_.reset();
    return result;
}